

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O3

int Map_LibraryDeriveGateInfo(Map_SuperLib_t *pLib,st__table *tExcludeGate)

{
  float *pfVar1;
  Map_Super_t *pGate;
  Map_Super_t *pMVar2;
  int iVar3;
  Mio_PinPhase_t MVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  Mio_Pin_t *pPin;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  uint uCanon [2];
  uint uTruths [6] [2];
  uint local_70 [2];
  uint local_68 [14];
  
  lVar11 = (long)pLib->nVarsMax;
  if (pLib->nVarsMax < pLib->nLines) {
    do {
      pGate = pLib->ppSupers[lVar11];
      if (tExcludeGate == (st__table *)0x0) {
        uVar10 = *(uint *)&pGate->field_0x4;
      }
      else {
        pcVar7 = Mio_GateReadName(pGate->pRoot);
        iVar3 = st__lookup(tExcludeGate,pcVar7,(char **)0x0);
        uVar10 = *(uint *)&pGate->field_0x4;
        if (iVar3 != 0) {
          uVar10 = uVar10 | 2;
          *(uint *)&pGate->field_0x4 = uVar10;
        }
        if ((uVar10 & 0x1c) != 0) {
          uVar8 = 0;
          do {
            if ((pGate->pFanins[uVar8]->field_0x4 & 2) != 0) {
              uVar10 = uVar10 | 2;
              *(uint *)&pGate->field_0x4 = uVar10;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < (uVar10 >> 2 & 7));
        }
      }
      if ((uVar10 & 0x1c) == 0) {
        uVar10 = 0;
      }
      else {
        uVar8 = 0;
        do {
          pMVar2 = pGate->pFanins[uVar8];
          local_68[uVar8 * 2] = pMVar2->uTruth[0];
          local_68[uVar8 * 2 + 1] = pMVar2->uTruth[1];
          uVar8 = uVar8 + 1;
          uVar10 = *(uint *)&pGate->field_0x4 >> 2 & 7;
        } while (uVar8 < uVar10);
      }
      Mio_DeriveTruthTable(pGate->pRoot,(uint (*) [2])local_68,uVar10,6,pGate->uTruth);
      iVar3 = pLib->nVarsMax;
      if (0 < (long)iVar3) {
        lVar12 = 0;
        do {
          *(undefined8 *)((long)&pGate->tDelaysR[0].Rise + lVar12) = 0xc61c3c00c61c3c00;
          *(undefined8 *)((long)&pGate->tDelaysF[0].Rise + lVar12) = 0xc61c3c00c61c3c00;
          lVar12 = lVar12 + 0xc;
        } while ((long)iVar3 * 0xc != lVar12);
      }
      pPin = Mio_GateReadPins(pGate->pRoot);
      uVar10 = *(uint *)&pGate->field_0x4;
      if ((uVar10 & 0x1c) != 0) {
        uVar8 = 0;
        do {
          if (pPin == (Mio_Pin_t *)0x0) {
            pcVar7 = "There are less pins than gate inputs.";
            goto LAB_00408d68;
          }
          pMVar2 = pGate->pFanins[uVar8];
          MVar4 = Mio_PinReadPhase(pPin);
          dVar15 = Mio_PinReadDelayBlockRise(pPin);
          fVar13 = (float)dVar15;
          dVar15 = Mio_PinReadDelayBlockFall(pPin);
          fVar14 = (float)dVar15;
          uVar10 = pLib->nVarsMax;
          uVar9 = (ulong)uVar10;
          if (MVar4 == MIO_PHASE_INV) {
            if (0 < (int)uVar10) {
LAB_00408aea:
              lVar12 = 0x9c;
              do {
                if ((0.0 <= *(float *)(pMVar2->uPhases + lVar12 + -0xc)) &&
                   (fVar16 = *(float *)(pMVar2->uPhases + lVar12 + -0xc) + fVar13,
                   *(float *)(pGate->uPhases + lVar12 + -0x54) <= fVar16 &&
                   fVar16 != *(float *)(pGate->uPhases + lVar12 + -0x54))) {
                  *(float *)(pGate->uPhases + lVar12 + -0x54) = fVar16;
                }
                if ((0.0 <= *(float *)(pMVar2->uPhases + lVar12 + -8)) &&
                   (fVar16 = *(float *)(pMVar2->uPhases + lVar12 + -8) + fVar13,
                   *(float *)(pGate->uPhases + lVar12 + -0x50) <= fVar16 &&
                   fVar16 != *(float *)(pGate->uPhases + lVar12 + -0x50))) {
                  *(float *)(pGate->uPhases + lVar12 + -0x50) = fVar16;
                }
                if ((0.0 <= *(float *)(pMVar2->uPhases + lVar12 + -0x54)) &&
                   (fVar16 = *(float *)(pMVar2->uPhases + lVar12 + -0x54) + fVar14,
                   *(float *)(pGate->uPhases + lVar12 + -0xc) <= fVar16 &&
                   fVar16 != *(float *)(pGate->uPhases + lVar12 + -0xc))) {
                  *(float *)(pGate->uPhases + lVar12 + -0xc) = fVar16;
                }
                if ((0.0 <= *(float *)(pMVar2->uPhases + lVar12 + -0x50)) &&
                   (fVar16 = *(float *)(pMVar2->uPhases + lVar12 + -0x50) + fVar14,
                   *(float *)(pGate->uPhases + lVar12 + -8) <= fVar16 &&
                   fVar16 != *(float *)(pGate->uPhases + lVar12 + -8))) {
                  *(float *)(pGate->uPhases + lVar12 + -8) = fVar16;
                }
                lVar12 = lVar12 + 0xc;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
            }
          }
          else if (0 < (int)uVar10) {
            lVar12 = 0;
            do {
              fVar16 = *(float *)((long)&pMVar2->tDelaysR[0].Rise + lVar12);
              if ((0.0 <= fVar16) &&
                 (fVar16 = fVar16 + fVar13,
                 pfVar1 = (float *)((long)&pGate->tDelaysR[0].Rise + lVar12),
                 *pfVar1 <= fVar16 && fVar16 != *pfVar1)) {
                *(float *)((long)&pGate->tDelaysR[0].Rise + lVar12) = fVar16;
              }
              fVar16 = *(float *)((long)&pMVar2->tDelaysR[0].Fall + lVar12);
              if ((0.0 <= fVar16) &&
                 (fVar16 = fVar16 + fVar13,
                 pfVar1 = (float *)((long)&pGate->tDelaysR[0].Fall + lVar12),
                 *pfVar1 <= fVar16 && fVar16 != *pfVar1)) {
                *(float *)((long)&pGate->tDelaysR[0].Fall + lVar12) = fVar16;
              }
              fVar16 = *(float *)((long)&pMVar2->tDelaysF[0].Rise + lVar12);
              if ((0.0 <= fVar16) &&
                 (fVar16 = fVar16 + fVar14,
                 pfVar1 = (float *)((long)&pGate->tDelaysF[0].Rise + lVar12),
                 *pfVar1 <= fVar16 && fVar16 != *pfVar1)) {
                *(float *)((long)&pGate->tDelaysF[0].Rise + lVar12) = fVar16;
              }
              fVar16 = *(float *)((long)&pMVar2->tDelaysF[0].Fall + lVar12);
              if ((0.0 <= fVar16) &&
                 (fVar16 = fVar16 + fVar14,
                 pfVar1 = (float *)((long)&pGate->tDelaysF[0].Fall + lVar12),
                 *pfVar1 <= fVar16 && fVar16 != *pfVar1)) {
                *(float *)((long)&pGate->tDelaysF[0].Fall + lVar12) = fVar16;
              }
              lVar12 = lVar12 + 0xc;
            } while (uVar9 * 0xc != lVar12);
            if (MVar4 != MIO_PHASE_NONINV && 0 < (int)uVar10) goto LAB_00408aea;
          }
          uVar8 = uVar8 + 1;
          pPin = Mio_PinReadNext(pPin);
          uVar10 = *(uint *)&pGate->field_0x4;
        } while (uVar8 < (uVar10 >> 2 & 7));
      }
      if (pPin != (Mio_Pin_t *)0x0) {
        pcVar7 = "There are more pins than gate inputs.";
LAB_00408d68:
        puts(pcVar7);
        return 0;
      }
      (pGate->tDelayMax).Rise = -9999.0;
      (pGate->tDelayMax).Fall = -9999.0;
      iVar3 = pLib->nVarsMax;
      if (0 < (long)iVar3) {
        lVar12 = 0;
        fVar14 = -9999.0;
        fVar13 = -9999.0;
        do {
          fVar16 = *(float *)((long)&pGate->tDelaysR[0].Rise + lVar12);
          if (fVar14 < fVar16) {
            (pGate->tDelayMax).Rise = fVar16;
            fVar14 = fVar16;
          }
          fVar16 = *(float *)((long)&pGate->tDelaysR[0].Fall + lVar12);
          if (fVar14 < fVar16) {
            (pGate->tDelayMax).Rise = fVar16;
            fVar14 = fVar16;
          }
          fVar16 = *(float *)((long)&pGate->tDelaysF[0].Rise + lVar12);
          if (fVar13 < fVar16) {
            (pGate->tDelayMax).Fall = fVar16;
            fVar13 = fVar16;
          }
          fVar17 = *(float *)((long)&pGate->tDelaysF[0].Fall + lVar12);
          if (fVar13 < fVar17) {
            (pGate->tDelayMax).Fall = fVar17;
            fVar13 = fVar17;
            fVar17 = *(float *)((long)&pGate->tDelaysF[0].Fall + lVar12);
          }
          if (fVar17 <= fVar16) {
            fVar17 = fVar16;
          }
          *(float *)((long)&pGate->tDelaysF[0].Worst + lVar12) = fVar17;
          fVar16 = *(float *)((long)&pGate->tDelaysR[0].Fall + lVar12);
          fVar17 = *(float *)((long)&pGate->tDelaysR[0].Rise + lVar12);
          if (fVar16 <= fVar17) {
            fVar16 = fVar17;
          }
          *(float *)((long)&pGate->tDelaysR[0].Worst + lVar12) = fVar16;
          lVar12 = lVar12 + 0xc;
        } while ((long)iVar3 * 0xc != lVar12);
      }
      *(uint *)&pGate->field_0x4 = uVar10 & 0xffffff1f | 0x20;
      dVar15 = Mio_GateReadArea(pGate->pRoot);
      fVar13 = (float)dVar15;
      pGate->Area = fVar13;
      uVar10 = *(uint *)&pGate->field_0x4;
      if ((uVar10 & 0x1c) != 0) {
        uVar8 = 0;
        uVar5 = uVar10;
        do {
          pMVar2 = pGate->pFanins[uVar8];
          uVar10 = uVar5 & 0xffffff1f | (uVar5 & 0xe0) + *(int *)&pMVar2->field_0x4 & 0xe0;
          *(uint *)&pGate->field_0x4 = uVar10;
          fVar13 = fVar13 + pMVar2->Area;
          pGate->Area = fVar13;
          uVar8 = uVar8 + 1;
          uVar6 = uVar5 >> 2;
          uVar5 = uVar10;
        } while (uVar8 < (uVar6 & 7));
      }
      if ((uVar10 & 3) == 1) {
        iVar3 = Map_LibraryGetMaxSuperPi_rec(pGate);
        if ((iVar3 < 0) || (pLib->nVarsMax <= iVar3)) {
          __assert_fail("nRealVars > 0 && nRealVars <= pLib->nVarsMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperTree.c"
                        ,0x2af,"int Map_LibraryDeriveGateInfo(Map_SuperLib_t *, st__table *)");
        }
        iVar3 = Map_CanonComputeSlow
                          (pLib->uTruths,pLib->nVarsMax,iVar3 + 1,pGate->uTruth,pGate->uPhases,
                           local_70);
        *(uint *)&pGate->field_0x4 = *(uint *)&pGate->field_0x4 & 0xfffffff | iVar3 << 0x1c;
        Map_SuperTableInsertC(pLib->tTableC,local_70,pGate);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pLib->nLines);
  }
  Map_SuperTableSortSupergatesByDelay(pLib->tTableC,pLib->nSupersAll);
  return 1;
}

Assistant:

int Map_LibraryDeriveGateInfo( Map_SuperLib_t * pLib, st__table * tExcludeGate )
{
    Map_Super_t * pGate, * pFanin;
    Mio_Pin_t * pPin;
    unsigned uCanon[2];
    unsigned uTruths[6][2];
    int i, k, nRealVars;

    // set all the derivable info related to the supergates
    for ( i = pLib->nVarsMax; i < (int)pLib->nLines; i++ )
    {
        pGate = pLib->ppSupers[i];

        if ( tExcludeGate )
        {
            if ( st__is_member( tExcludeGate, Mio_GateReadName( pGate->pRoot ) ) )
                pGate->fExclude = 1;
            for ( k = 0; k < (int)pGate->nFanins; k++ )
            {
                pFanin = pGate->pFanins[k];
                if ( pFanin->fExclude )
                {
                    pGate->fExclude = 1;
                    continue;
                }
            }
        }
        
        // collect the truth tables of the fanins
        for ( k = 0; k < (int)pGate->nFanins; k++ )
        {
            pFanin = pGate->pFanins[k];
            uTruths[k][0] = pFanin->uTruth[0];
            uTruths[k][1] = pFanin->uTruth[1];
        }
        // derive the new truth table
        Mio_DeriveTruthTable( pGate->pRoot, uTruths, pGate->nFanins, 6, pGate->uTruth );

        // set the initial delays of the supergate
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            pGate->tDelaysR[k].Rise = pGate->tDelaysR[k].Fall = MAP_NO_VAR;
            pGate->tDelaysF[k].Rise = pGate->tDelaysF[k].Fall = MAP_NO_VAR;
        }
        // get the linked list of pins for the given root gate
        pPin = Mio_GateReadPins( pGate->pRoot );
        // update the initial delay of the supergate using info from the corresponding pin
        for ( k = 0; k < (int)pGate->nFanins; k++, pPin = Mio_PinReadNext(pPin) )
        {
            // if there is no corresponding pin, this is a bug, return fail
            if ( pPin == NULL )
            {
                printf( "There are less pins than gate inputs.\n" );
                return 0;
            }
            // update the delay information of k-th fanins info from the corresponding pin
            Map_LibraryAddFaninDelays( pLib, pGate, pGate->pFanins[k], pPin );
        }
        // if there are some pins left, this is a bug, return fail
        if ( pPin != NULL )
        {
            printf( "There are more pins than gate inputs.\n" );
            return 0;
        }
        // find the max delay
        pGate->tDelayMax.Rise = pGate->tDelayMax.Fall = MAP_NO_VAR;
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            // the rise of the output depends on the rise and fall of the output
            if ( pGate->tDelayMax.Rise < pGate->tDelaysR[k].Rise )
                pGate->tDelayMax.Rise = pGate->tDelaysR[k].Rise;
            if ( pGate->tDelayMax.Rise < pGate->tDelaysR[k].Fall )
                pGate->tDelayMax.Rise = pGate->tDelaysR[k].Fall;
            // the fall of the output depends on the rise and fall of the output
            if ( pGate->tDelayMax.Fall < pGate->tDelaysF[k].Rise )
                pGate->tDelayMax.Fall = pGate->tDelaysF[k].Rise;
            if ( pGate->tDelayMax.Fall < pGate->tDelaysF[k].Fall )
                pGate->tDelayMax.Fall = pGate->tDelaysF[k].Fall;

            pGate->tDelaysF[k].Worst = MAP_MAX( pGate->tDelaysF[k].Fall, pGate->tDelaysF[k].Rise );
            pGate->tDelaysR[k].Worst = MAP_MAX( pGate->tDelaysR[k].Fall, pGate->tDelaysR[k].Rise );
        }

        // count gates and area of the supergate
        pGate->nGates = 1;
        pGate->Area   = (float)Mio_GateReadArea(pGate->pRoot);
        for ( k = 0; k < (int)pGate->nFanins; k++ )
        {
            pGate->nGates += pGate->pFanins[k]->nGates;
            pGate->Area   += pGate->pFanins[k]->Area;
        }
        // do not add the gate to the table, if this gate is an internal gate
        // of some supegate and does not correspond to a supergate output
        if ( ( !pGate->fSuper ) || pGate->fExclude )
            continue;

        // find the maximum index of a variable in the support of the supergates
        // this is important for two reasons:
        // (1) to limit the number of permutations considered for canonicization
        // (2) to get rid of equivalence phases to speed-up matching
        nRealVars = Map_LibraryGetMaxSuperPi_rec( pGate ) + 1;
        assert( nRealVars > 0 && nRealVars <= pLib->nVarsMax );
        // if there are some problems with this code, try this instead
//        nRealVars = pLib->nVarsMax;

        // find the N-canonical form of this supergate
        pGate->nPhases = Map_CanonComputeSlow( pLib->uTruths, pLib->nVarsMax, nRealVars, pGate->uTruth, pGate->uPhases, uCanon );
        // add the supergate into the table by its N-canonical table
        Map_SuperTableInsertC( pLib->tTableC, uCanon, pGate );
/*
        {
            int uCanon1, uCanon2;
            uCanon1 = uCanon[0];
            pGate->uTruth[0] = ~pGate->uTruth[0];
            pGate->uTruth[1] = ~pGate->uTruth[1];
            Map_CanonComputeSlow( pLib->uTruths, pLib->nVarsMax, nRealVars, pGate->uTruth, pGate->uPhases, uCanon );
            uCanon2 = uCanon[0];
Rwt_Man5ExploreCount( uCanon1 < uCanon2 ? uCanon1 : uCanon2 );
        }
*/
    }
    // sort the gates in each line
    Map_SuperTableSortSupergatesByDelay( pLib->tTableC, pLib->nSupersAll );

    // let the glory be manifest
//    Map_LibraryPrintTree( pLib );
    return 1;
}